

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

void op_http_conn_read_rate_update(OpusHTTPConn *_conn)

{
  long lVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  op_time read_time;
  
  lVar1 = _conn->read_bytes;
  if (0 < lVar1) {
    op_time_get(&read_time);
    uVar3 = op_time_diff_ms(&read_time,&_conn->read_time);
    uVar4 = 1;
    if (1 < (int)uVar3) {
      uVar4 = (ulong)uVar3;
    }
    lVar2 = _conn->read_rate;
    (_conn->read_time).tv_sec = read_time.tv_sec;
    (_conn->read_time).tv_nsec = read_time.tv_nsec;
    _conn->read_bytes = 0;
    _conn->read_rate = ((long)(((ulong)(lVar1 * 1000) / uVar4 - lVar2) + 4) >> 3) + lVar2;
  }
  return;
}

Assistant:

static void op_http_conn_read_rate_update(OpusHTTPConn *_conn){
  op_time      read_time;
  opus_int32   read_delta_ms;
  opus_int64   read_delta_bytes;
  opus_int64   read_rate;
  read_delta_bytes=_conn->read_bytes;
  if(read_delta_bytes<=0)return;
  op_time_get(&read_time);
  read_delta_ms=op_time_diff_ms(&read_time,&_conn->read_time);
  read_rate=_conn->read_rate;
  read_delta_ms=OP_MAX(read_delta_ms,1);
  read_rate+=read_delta_bytes*1000/read_delta_ms-read_rate+4>>3;
  *&_conn->read_time=*&read_time;
  _conn->read_bytes=0;
  _conn->read_rate=read_rate;
}